

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::disassemble::InstructionDisassembler::SetGrey
          (InstructionDisassembler *this,ostream *stream)

{
  char *pcVar1;
  grey local_9;
  
  if (this->color_ == true) {
    local_9.isPrint = this->print_;
    pcVar1 = clr::grey::operator_cast_to_char_(&local_9);
    std::operator<<(stream,pcVar1);
  }
  return;
}

Assistant:

void InstructionDisassembler::SetGrey(std::ostream& stream) const {
  if (color_) stream << spvtools::clr::grey{print_};
}